

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O0

bool __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
move_next(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
          *this)

{
  sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  
  if (((in_RDI->at_start_ & 1U) == 0) || (in_RDI->sequence_size == 0)) {
    if (in_RDI->current_enumeration_node != (node *)0x0) {
      in_RDI->current_enumeration_pos = in_RDI->current_enumeration_pos + 1;
      if (in_RDI->current_enumeration_pos < in_RDI->sequence_size) {
        in_RDI->current_enumeration_node = in_RDI->current_enumeration_node->right;
      }
      else {
        in_RDI->current_enumeration_node = (node *)0x0;
      }
    }
  }
  else {
    move_to_pos(in_RDI,&in_RDI->current_node,&in_RDI->current_pos,0,in_RDI->sequence_size);
    in_RDI->current_enumeration_node = in_RDI->current_node;
    in_RDI->current_enumeration_pos = 0;
  }
  in_RDI->at_start_ = false;
  return in_RDI->current_enumeration_node != (node *)0x0;
}

Assistant:

bool sequence_kernel_2<T,mem_manager>::
    move_next (
    ) const
    {
        if (at_start_ && sequence_size>0)
        {            
            move_to_pos(current_node,current_pos,0,sequence_size);            
            current_enumeration_node = current_node;
            current_enumeration_pos = 0;
        }
        else if (current_enumeration_node!=0)
        {
            ++current_enumeration_pos;
            if (current_enumeration_pos<sequence_size)
            {                
                current_enumeration_node = current_enumeration_node->right;
            }
            else
            {
                // we have reached the end of the sequence
                current_enumeration_node = 0;
            }
        }

        at_start_ = false;
        return (current_enumeration_node!=0);
    }